

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O1

void anon_unknown.dwarf_32b84a::check_linked_definition(database *db,value_type *link)

{
  uint uVar1;
  value_reference_type ppVar2;
  address aVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  address definition_address;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  shared_ptr<const_pstore::repo::compilation> compilation;
  const_iterator pos;
  internal local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  address local_228;
  address local_220;
  AssertHelper local_218;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  iterator_base<true> local_200;
  const_iterator local_110;
  
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&local_210,db,true);
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::find<pstore::uint128,void>
            (&local_110,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)local_210,db,&link->compilation);
  memset(&local_200.visited_parents_,0,0xd8);
  local_200.index_ = local_210;
  local_200.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
          )0x0;
  local_200.db_ = db;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
            (local_238,"pos","compilation_index->end (db)",&local_110,&local_200);
  if (local_200.pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
       )0x0) {
    operator_delete((void *)local_200.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_230 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_230->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if (local_200.db_ != (database *)0x0) {
      (*(local_200.db_)->_vptr_database[1])();
    }
    if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_230,local_230);
    }
    goto LAB_001768ca;
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  ppVar2 = pstore::index::
           hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           ::iterator_base<true>::operator*(&local_110);
  pstore::repo::compilation::load((compilation *)&local_200,db,&ppVar2->second);
  local_228.a_._0_4_ =
       *(undefined4 *)
        &((local_200.db_)->storage_).file_.
         super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
            (local_238,"link.index","compilation->size ()",&link->index,(uint *)&local_228);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_228.a_ + 0x10),
               "index must lie within the number of definitions in this compilation",0x43);
    if (local_230 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_230->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_220,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
    aVar3.a_ = local_228.a_;
LAB_0017689c:
    if ((long *)aVar3.a_ != (long *)0x0) {
      (**(code **)(*(long *)aVar3.a_ + 8))();
    }
  }
  else {
    if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_230,local_230);
    }
    uVar1 = link->index;
    if (*(uint *)&((local_200.db_)->storage_).file_.
                  super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr <=
        uVar1) {
      pstore::assert_failed
                ("i < size_",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                 ,0xa9);
    }
    ppVar2 = pstore::index::
             hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::iterator_base<true>::operator*(&local_110);
    local_228.a_ = (ppVar2->second).addr.a_.a_ + (ulong)uVar1 * 0x30 + 0x20;
    local_220.a_ = (link->pointer).a_.a_;
    testing::internal::CmpHelperEQ<pstore::address,pstore::address>
              (local_238,"definition_address","link.pointer.to_address ()",&local_228,&local_220);
    if (local_238[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_220);
      if (local_230 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_230->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                 ,0x79,pcVar4);
      testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      aVar3.a_ = local_220.a_;
      goto LAB_0017689c;
    }
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  if (local_200.visited_parents_.c_._M_elems[0].node.internal_ != (internal_node *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_200.visited_parents_.c_._M_elems[0].node.internal_);
  }
LAB_001768ca:
  if (local_110.pos_._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
       )0x0) {
    operator_delete((void *)local_110.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
  }
  return;
}

Assistant:

void check_linked_definition (database const & db,
                                  repo::linked_definitions::value_type const & link) {
        // Find and load the compilation that link references.
        auto const compilation_index =
            pstore::index::get_index<pstore::trailer::indices::compilation> (db);
        auto const pos = compilation_index->find (db, link.compilation);
        ASSERT_NE (pos, compilation_index->end (db));

        std::shared_ptr<repo::compilation const> const compilation =
            repo::compilation::load (db, pos->second);
        ASSERT_LT (link.index, compilation->size ())
            << "index must lie within the number of definitions in this compilation";

        // Compute the offset of the link.index definition from the start of the compilation's
        // storage (c).
        auto const offset = reinterpret_cast<std::uintptr_t> (&(*compilation)[link.index]) -
                            reinterpret_cast<std::uintptr_t> (compilation.get ());
        // Compute the address of the link.index definition.
        auto const definition_address = pos->second.addr.to_address () + offset;
        ASSERT_EQ (definition_address, link.pointer.to_address ());
    }